

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxArray * __thiscall amrex::BoxArray::shift(BoxArray *this,int dir,int nzones)

{
  element_type *peVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  
  uniqify(this);
  peVar1 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  uVar3 = (int)((long)*(pointer *)
                       ((long)&(peVar1->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) * -0x49249249;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)(uVar3 & 0x7fffffff);
    piVar5 = (int *)(lVar2 + (long)dir * 4);
    do {
      *piVar5 = *piVar5 + nzones;
      piVar5[3] = piVar5[3] + nzones;
      piVar5 = piVar5 + 7;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::shift (int dir,
                 int nzones)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].shift(dir, nzones);
    }
    return *this;
}